

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::SymIsIntconstOrSelf(BackwardPass *this,Sym *sym,Opnd *opnd)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  
  if (sym->m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1e25,"(sym->IsStackSym())","sym->IsStackSym()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  bVar3 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar3) {
    pRVar5 = IR::Opnd::AsRegOpnd(opnd);
    pSVar1 = pRVar5->m_sym;
    if (pSVar1 == (StackSym *)sym) {
      return true;
    }
    if (((pSVar1->field_5).m_instrDef != (Instr *)0x0 & pSVar1->field_0x18) == 1) {
      return ((pSVar1->field_5).m_instrDef)->m_opcode == LdC_A_I4;
    }
  }
  return false;
}

Assistant:

bool 
BackwardPass::SymIsIntconstOrSelf(Sym *sym, IR::Opnd *opnd)
{
    Assert(sym->IsStackSym());
    if (!opnd->IsRegOpnd())
    {
        return false;
    }
    StackSym *opndSym = opnd->AsRegOpnd()->m_sym;

    if (sym == opndSym)
    {
        return true;
    }

    if (!opndSym->IsSingleDef())
    {
        return false;
    }

    if (opndSym->GetInstrDef()->m_opcode == Js::OpCode::LdC_A_I4)
    {
        return true;
    }

    return false;
}